

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_to_temp(archive_write *a,void *buff,size_t s)

{
  long lVar1;
  ssize_t sVar2;
  uint *puVar3;
  size_t in_RDX;
  void *in_RSI;
  archive *in_RDI;
  uchar *b;
  ssize_t written;
  iso9660_conflict *iso9660;
  void *local_38;
  size_t local_20;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  local_38 = in_RSI;
  local_20 = in_RDX;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    sVar2 = write(*(int *)(lVar1 + 8),local_38,local_20);
    if (sVar2 < 0) break;
    local_20 = local_20 - sVar2;
    local_38 = (void *)(sVar2 + (long)local_38);
  }
  puVar3 = (uint *)__errno_location();
  archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t write to temporary file");
  return -0x1e;
}

Assistant:

static int
write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	ssize_t written;
	const unsigned char *b;

	b = (const unsigned char *)buff;
	while (s) {
		written = write(iso9660->temp_fd, b, s);
		if (written < 0) {
			archive_set_error(&a->archive, errno,
			    "Can't write to temporary file");
			return (ARCHIVE_FATAL);
		}
		s -= written;
		b += written;
	}
	return (ARCHIVE_OK);
}